

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void __thiscall mat_lib::matrix<double>::matrix(matrix<double> *this,string *file_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__nptr;
  double dVar2;
  _Alloc_hider _Var3;
  long *__s;
  bool bVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  element_t *peVar8;
  ostream *poVar9;
  logic_error *plVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  cmatch results;
  regex rx;
  string str;
  ifstream ifs;
  string_type local_478;
  ulong local_458;
  int local_44c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_428;
  size_t *local_400;
  anon_union_16_2_ba345be5_for_m_Storage local_3f8;
  ulong local_3e8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_3e0;
  iterator_range<const_char_*> local_3c0;
  long *local_3b0 [2];
  long local_3a0 [45];
  long local_238 [4];
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  (this->super_base_matrix<double>).format__ = fixed;
  (this->super_base_matrix<double>).fractional_digits__ = 6;
  this->rows__ = 0;
  this->columns__ = 0;
  this->elements__ = (element_t *)0x0;
  std::ifstream::ifstream(local_238,(string *)file_name,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
LAB_0013e904:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"cannot open file \"",0x12);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b0,(file_name->_M_dataplus)._M_p,
                        file_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"! (",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"matrix",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"() in ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x11e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(plVar10,(string *)&local_3e0);
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)local_3b0,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_3e0,
             "mat_lib::matrix\\[(\\d+)x(\\d)\\]\\{\\n\\s*(([-+]?\\d*\\.?\\d+([eE][-+]?\\d+)?(,\\s|\\n\\s*)?)+)+\\n\\}"
             ,0x10);
  __s = local_3b0[0];
  local_428.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428._M_begin = (char *)0x0;
  local_428.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar5 = strlen((char *)local_3b0[0]);
  bVar4 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((char *)__s,(char *)((long)__s + sVar5),&local_428,&local_3e0,0);
  if (!bVar4) {
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar10,"the file are incorrect: bad expresion");
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::str(&local_478,&local_428,1);
  _Var3._M_p = local_478._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar12 = *piVar6;
  *piVar6 = 0;
  sVar7 = strtol(_Var3._M_p,(char **)&local_448,10);
  if (local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)_Var3._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_0013ea58:
    std::__throw_out_of_range("stoi");
LAB_0013ea64:
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (((long)(int)sVar7 != sVar7) || (*piVar6 == 0x22)) goto LAB_0013ea58;
    if (*piVar6 == 0) {
      *piVar6 = iVar12;
    }
    this->rows__ = sVar7;
    paVar1 = &local_478.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != paVar1) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&local_478,&local_428,2);
    _Var3._M_p = local_478._M_dataplus._M_p;
    iVar12 = *piVar6;
    *piVar6 = 0;
    sVar7 = strtol(local_478._M_dataplus._M_p,(char **)&local_448,10);
    if (local_448.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)_Var3._M_p) goto LAB_0013ea64;
    if ((0xfffffffeffffffff < sVar7 - 0x80000000) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar12;
      }
      this->columns__ = sVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != paVar1) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::
      match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
                (&local_478,&local_428,3);
      local_3c0.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "(,|\n)";
      local_3c0.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                ((is_any_ofF<char> *)&local_3f8,&local_3c0);
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
                (&local_448,&local_478,(is_any_ofF<char> *)&local_3f8,token_compress_off);
      if ((0x10 < local_3e8) && (local_3f8.m_dynSet != (set_value_type *)0x0)) {
        operator_delete__(local_3f8.m_dynSet);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != paVar1) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (long)local_448.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_448.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar13 = this->rows__;
      uVar15 = this->columns__;
      if (uVar11 == uVar15 * uVar13) {
        peVar8 = (element_t *)
                 operator_new__(-(ulong)(uVar11 >> 0x3d != 0) |
                                (long)local_448.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_448.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2);
        this->elements__ = peVar8;
        if (uVar13 != 0) {
          local_458 = 0;
          iVar12 = 0;
          local_400 = &this->rows__;
          do {
            if (uVar15 == 0) {
              uVar15 = 0;
            }
            else {
              iVar14 = *piVar6;
              lVar16 = (long)iVar12 << 5;
              file_name = (string *)0x0;
              uVar13 = 0;
              local_44c = iVar12;
              do {
                __nptr = *(char **)((long)&((local_448.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar16);
                *piVar6 = 0;
                dVar2 = strtod(__nptr,(char **)&local_478);
                if (local_478._M_dataplus._M_p == __nptr) {
                  std::__throw_invalid_argument("stod");
LAB_0013e8f8:
                  std::__throw_out_of_range("stod");
                  goto LAB_0013e904;
                }
                iVar12 = *piVar6;
                if (iVar12 == 0) {
                  *piVar6 = iVar14;
                }
                else {
                  iVar14 = iVar12;
                  if (iVar12 == 0x22) goto LAB_0013e8f8;
                }
                uVar15 = this->columns__;
                *(double *)
                 ((long)this->elements__ + ((long)file_name >> 0x1d) + uVar15 * local_458 * 8) =
                     dVar2;
                uVar13 = uVar13 + 1;
                lVar16 = lVar16 + 0x20;
                file_name = file_name + 0x8000000;
              } while (uVar13 < uVar15);
              iVar12 = local_44c + (int)uVar13;
              uVar13 = *local_400;
            }
            local_458 = local_458 + 1;
          } while (local_458 < uVar13);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_448);
        if (local_428.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_428.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_428.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_428.
                                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3e0)
        ;
        if (local_3b0[0] != local_3a0) {
          operator_delete(local_3b0[0],local_3a0[0] + 1);
        }
        std::ifstream::~ifstream(local_238);
        return;
      }
      goto LAB_0013ea7c;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0013ea7c:
  plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar10,"the file are incorrect: bad declaration of matrix");
  __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

matrix<T>::matrix(const string& file_name) // constructor from a file
  : rows__{0},
    columns__{0},
    elements__{nullptr}
  {
    ifstream ifs(file_name);
    if(!ifs)
    {
      ostringstream str_stream;
      str_stream<<"cannot open file \""<<file_name<<"\"! ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw logic_error(str_stream.str());
    }

    string str((istreambuf_iterator<char>(ifs)),
               istreambuf_iterator<char>());

    regex rx(R"(mat_lib::matrix\[(\d+)x(\d)\]\{\n\s*(([-+]?\d*\.?\d+([eE][-+]?\d+)?(,\s|\n\s*)?)+)+\n\})");
    cmatch results;
    if (not regex_match(str.c_str(),results,rx)) {
        throw logic_error("the file are incorrect: bad expresion");
    }

    rows__ = stoi(results.str(1));
    columns__ = stoi(results.str(2));
    vector<string> numbers;
    boost::split(numbers, results.str(3), boost::is_any_of("(,|\n)"));


    if (numbers.size() != rows__*columns__) {
      throw logic_error("the file are incorrect: bad declaration of matrix");
    }

    elements__ = new element_t[rows__*columns__];

    int index = 0;
    for(size_t i=0; i<rows__; i++){
      for(size_t j=0; j<columns__; j++) {
          elements__[offset__(i, j)] = stod(numbers[index]);
          index++;
      }
    }
  }